

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeoffsets_tests.cpp
# Opt level: O0

void __thiscall timeoffsets_tests::timeoffsets_warning::test_method(timeoffsets_warning *this)

{
  initializer_list<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> __l;
  bool bVar1;
  long in_FS_OFFSET;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  *in_stack_fffffffffffffc28;
  undefined7 in_stack_fffffffffffffc30;
  undefined1 in_stack_fffffffffffffc37;
  assertion_result *in_stack_fffffffffffffc38;
  undefined7 in_stack_fffffffffffffc40;
  undefined1 in_stack_fffffffffffffc47;
  value_type *in_stack_fffffffffffffc48;
  value_type *__value;
  const_string *in_stack_fffffffffffffc50;
  const_string *msg;
  vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  *in_stack_fffffffffffffc58;
  vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  *this_00;
  const_string *in_stack_fffffffffffffc60;
  vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  *in_stack_fffffffffffffc68;
  undefined8 in_stack_fffffffffffffc70;
  undefined7 in_stack_fffffffffffffc78;
  undefined1 in_stack_fffffffffffffc7f;
  undefined1 local_281 [41];
  assertion_result local_258;
  const_string local_230;
  const_string local_220 [2];
  lazy_ostream local_200 [2];
  rep local_1d8;
  assertion_result local_1b0 [2];
  const_string local_178 [2];
  lazy_ostream local_158 [2];
  rep local_130;
  assertion_result local_108 [2];
  const_string local_d0 [2];
  lazy_ostream local_b0 [4];
  assertion_result local_70 [2];
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc38,
               (pointer)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
               (unsigned_long)in_stack_fffffffffffffc28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,
               (size_t)in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
    local_28 = 0xfffffffffffff8f8;
    uStack_20 = 0;
    local_38 = 0xfffffffffffff1f0;
    uStack_30 = 0xfffffffffffff6a0;
    local_18 = 600;
    std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::allocator
              ((allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
               in_stack_fffffffffffffc28);
    __l._M_len._0_7_ = in_stack_fffffffffffffc78;
    __l._M_array = (iterator)in_stack_fffffffffffffc70;
    __l._M_len._7_1_ = in_stack_fffffffffffffc7f;
    std::
    vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
    ::vector(in_stack_fffffffffffffc68,__l,(allocator_type *)in_stack_fffffffffffffc60);
    IsWarningRaised((vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                     *)in_stack_fffffffffffffc50);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffc38,(bool)in_stack_fffffffffffffc37);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc38,
               (pointer)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
               (unsigned_long)in_stack_fffffffffffffc28);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
               (basic_cstring<const_char> *)in_stack_fffffffffffffc28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc38,
               (pointer)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
               (unsigned_long)in_stack_fffffffffffffc28);
    in_stack_fffffffffffffc28 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_70,local_b0,local_d0,0x40,CHECK,CHECK_PRED)
    ;
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffc28);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffc28);
    std::
    vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
    ::~vector((vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
               *)in_stack_fffffffffffffc38);
    std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::~allocator
              ((allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
               in_stack_fffffffffffffc28);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc38,
               (pointer)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
               (unsigned_long)in_stack_fffffffffffffc28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,
               (size_t)in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
    local_130 = (rep)min<(char)49,(char)49>();
    std::chrono::duration<long,std::ratio<1l,1l>>::duration<long,std::ratio<60l,1l>,void>
              ((duration<long,_std::ratio<1L,_1L>_> *)
               CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
               (duration<long,_std::ratio<60L,_1L>_> *)in_stack_fffffffffffffc28);
    std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::allocator
              ((allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
               in_stack_fffffffffffffc28);
    std::
    vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
    ::vector(in_stack_fffffffffffffc58,(size_type)in_stack_fffffffffffffc50,
             in_stack_fffffffffffffc48,
             (allocator_type *)CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40));
    IsWarningRaised((vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                     *)in_stack_fffffffffffffc50);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffc38,(bool)in_stack_fffffffffffffc37);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc38,
               (pointer)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
               (unsigned_long)in_stack_fffffffffffffc28);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
               (basic_cstring<const_char> *)in_stack_fffffffffffffc28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc38,
               (pointer)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
               (unsigned_long)in_stack_fffffffffffffc28);
    in_stack_fffffffffffffc28 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_108,local_158,local_178,0x41,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffc28);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffc28);
    std::
    vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
    ::~vector((vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
               *)in_stack_fffffffffffffc38);
    std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::~allocator
              ((allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
               in_stack_fffffffffffffc28);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc38,
               (pointer)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
               (unsigned_long)in_stack_fffffffffffffc28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,
               (size_t)in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
    local_1d8 = (rep)min<(char)54,(char)48>();
    std::chrono::duration<long,std::ratio<1l,1l>>::duration<long,std::ratio<60l,1l>,void>
              ((duration<long,_std::ratio<1L,_1L>_> *)
               CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
               (duration<long,_std::ratio<60L,_1L>_> *)in_stack_fffffffffffffc28);
    std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::allocator
              ((allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
               in_stack_fffffffffffffc28);
    std::
    vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
    ::vector(in_stack_fffffffffffffc58,(size_type)in_stack_fffffffffffffc50,
             in_stack_fffffffffffffc48,
             (allocator_type *)CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40));
    IsWarningRaised((vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                     *)in_stack_fffffffffffffc50);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffc38,(bool)in_stack_fffffffffffffc37);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc38,
               (pointer)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
               (unsigned_long)in_stack_fffffffffffffc28);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
               (basic_cstring<const_char> *)in_stack_fffffffffffffc28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc38,
               (pointer)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
               (unsigned_long)in_stack_fffffffffffffc28);
    in_stack_fffffffffffffc28 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1b0,local_200,local_220,0x43,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffc28);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffc28);
    std::
    vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
    ::~vector((vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
               *)in_stack_fffffffffffffc38);
    std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::~allocator
              ((allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
               in_stack_fffffffffffffc28);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    msg = &local_230;
    __value = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc38,
               (pointer)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
               (unsigned_long)in_stack_fffffffffffffc28);
    this_00 = (vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
               *)&stack0xfffffffffffffdc0;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,
               (size_t)this_00,msg);
    local_281._1_8_ = min<(char)51>();
    in_stack_fffffffffffffc60 = (const_string *)(local_281 + 9);
    std::chrono::duration<long,std::ratio<1l,1l>>::duration<long,std::ratio<60l,1l>,void>
              ((duration<long,_std::ratio<1L,_1L>_> *)
               CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
               (duration<long,_std::ratio<60L,_1L>_> *)in_stack_fffffffffffffc28);
    in_stack_fffffffffffffc68 =
         (vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
          *)local_281;
    std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::allocator
              ((allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
               in_stack_fffffffffffffc28);
    std::
    vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
    ::vector(this_00,(size_type)msg,__value,
             (allocator_type *)CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40));
    in_stack_fffffffffffffc47 =
         IsWarningRaised((vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                          *)msg);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffc38,(bool)in_stack_fffffffffffffc37);
    in_stack_fffffffffffffc38 = (assertion_result *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc38,
               (pointer)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
               (unsigned_long)in_stack_fffffffffffffc28);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
               (basic_cstring<const_char> *)in_stack_fffffffffffffc28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc38,
               (pointer)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
               (unsigned_long)in_stack_fffffffffffffc28);
    in_stack_fffffffffffffc28 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_258,(lazy_ostream *)&stack0xfffffffffffffd58,
               (const_string *)&stack0xfffffffffffffd38,0x44,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffc28);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffc28);
    std::
    vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
    ::~vector((vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
               *)in_stack_fffffffffffffc38);
    std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::~allocator
              ((allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
               in_stack_fffffffffffffc28);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(timeoffsets_warning)
{
    BOOST_CHECK(IsWarningRaised({{-60min, -40min, -30min, 0min, 10min}}));
    BOOST_CHECK(IsWarningRaised({5, 11min}));

    BOOST_CHECK(!IsWarningRaised({4, 60min}));
    BOOST_CHECK(!IsWarningRaised({100, 3min}));
}